

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

QBindingStatus * __thiscall
QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus
          (BindingStatusOrList *this,QObject *object)

{
  long lVar1;
  memory_order mVar2;
  List *pLVar3;
  pointer ppQVar4;
  vector<QObject_*,_std::allocator<QObject_*>_> *in_RDI;
  long in_FS_OFFSET;
  List *objectList;
  QBindingStatus *status;
  memory_order __b;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  List *in_stack_ffffffffffffff98;
  int __line;
  vector<QObject_*,_std::allocator<QObject_*>_> *in_stack_ffffffffffffffa0;
  vector<QObject_*,_std::allocator<QObject_*>_> *this_00;
  QBindingStatus *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_38 = bindingStatus((BindingStatusOrList *)in_stack_ffffffffffffffa0);
  if (local_38 == (QBindingStatus *)0x0) {
    pLVar3 = list((BindingStatusOrList *)in_stack_ffffffffffffff98);
    if (pLVar3 == (List *)0x0) {
      pLVar3 = (List *)operator_new(0x18);
      memset(pLVar3,0,0x18);
      std::vector<QObject_*,_std::allocator<QObject_*>_>::vector
                ((vector<QObject_*,_std::allocator<QObject_*>_> *)0x55707e);
      in_stack_ffffffffffffff98 = pLVar3;
      std::vector<QObject_*,_std::allocator<QObject_*>_>::reserve(this_00,(size_type)local_38);
      ppQVar4 = (pointer)encodeList(pLVar3);
      mVar2 = std::operator&(memory_order_relaxed,__memory_order_mask);
      __line = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (mVar2 == memory_order_acquire) {
        std::__replacement_assert
                  ((char *)in_RDI,__line,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
      }
      if (mVar2 == memory_order_acq_rel) {
        std::__replacement_assert
                  ((char *)in_RDI,__line,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
      }
      if (mVar2 == memory_order_consume) {
        std::__replacement_assert
                  ((char *)in_RDI,__line,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
      }
      (in_RDI->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>)._M_impl.
      super__Vector_impl_data._M_start = ppQVar4;
      in_stack_ffffffffffffffa0 = in_RDI;
    }
    std::vector<QObject_*,_std::allocator<QObject_*>_>::push_back
              (in_stack_ffffffffffffffa0,(value_type *)in_stack_ffffffffffffff98);
    local_38 = (QBindingStatus *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QBindingStatus *QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus(QObject *object)
{
    if (auto status = bindingStatus())
        return status;
    List *objectList = list();
    if (!objectList) {
        objectList = new List();
        objectList->reserve(8);
        data.store(encodeList(objectList), std::memory_order_relaxed);
    }
    objectList->push_back(object);
    return nullptr;
}